

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<unsigned_char,false,std::allocator<unsigned_long>>::assign<unsigned_long_const*>
          (View<unsigned_char,false,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,pointer data,CoordinateOrder *externalCoordinateOrder,
          CoordinateOrder *internalCoordinateOrder,allocator_type *allocator)

{
  unsigned_long *__dest;
  allocator_type local_59;
  Geometry<std::allocator<unsigned_long>> local_58 [8];
  void *local_50;
  long local_38;
  undefined8 local_30;
  undefined4 local_28;
  View<unsigned_char,false,std::allocator<unsigned_long>> local_24;
  
  marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
            (local_58,begin,end,externalCoordinateOrder,internalCoordinateOrder,&local_59);
  if (local_58 != (Geometry<std::allocator<unsigned_long>> *)(this + 8)) {
    __dest = *(unsigned_long **)(this + 0x10);
    if (local_38 != *(long *)(this + 0x28)) {
      operator_delete(__dest,*(long *)(this + 0x28) * 0x18);
      *(long *)(this + 0x28) = local_38;
      __dest = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)(this + 8),local_38 * 3,(void *)0x0);
      *(unsigned_long **)(this + 0x10) = __dest;
      *(unsigned_long **)(this + 0x18) = __dest + *(long *)(this + 0x28);
      *(unsigned_long **)(this + 0x20) = __dest + *(long *)(this + 0x28) + *(long *)(this + 0x28);
      *(long *)(this + 0x28) = local_38;
    }
    memcpy(__dest,local_50,local_38 * 0x18);
    *(undefined8 *)(this + 0x30) = local_30;
    *(undefined4 *)(this + 0x38) = local_28;
    this[0x3c] = local_24;
  }
  operator_delete(local_50,local_38 * 0x18);
  *(pointer *)this = data;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::assign
(
    ShapeIterator begin,
    ShapeIterator end,
    pointer data,
    const CoordinateOrder& externalCoordinateOrder,
    const CoordinateOrder& internalCoordinateOrder,
    const allocator_type& allocator
)
{
    // the invariant is not tested as a pre-condition of this
    // function to allow for unsafe manipulations prior to its
    // call
    geometry_ = typename marray_detail::Geometry<A>(begin, end, 
        externalCoordinateOrder, internalCoordinateOrder, allocator);
    data_ = data;
    testInvariant();    
}